

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

auto_ptr<cmFileListGeneratorBase> __thiscall
cmFileListGeneratorProject::Clone(cmFileListGeneratorProject *this)

{
  cmFileListGeneratorProject *this_00;
  cmFileListGeneratorProject *in_RSI;
  cmFileListGeneratorProject *this_local;
  auto_ptr<cmFileListGeneratorBase> *g;
  
  this_00 = (cmFileListGeneratorProject *)operator_new(0x18);
  cmFileListGeneratorProject(this_00,in_RSI);
  cmsys::auto_ptr<cmFileListGeneratorBase>::auto_ptr
            ((auto_ptr<cmFileListGeneratorBase> *)this,(cmFileListGeneratorBase *)this_00);
  return (auto_ptr<cmFileListGeneratorBase>)&this->super_cmFileListGeneratorBase;
}

Assistant:

virtual cmsys::auto_ptr<cmFileListGeneratorBase> Clone() const
    {
    cmsys::auto_ptr<cmFileListGeneratorBase>
      g(new cmFileListGeneratorProject(*this));
    return g;
    }